

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.h
# Opt level: O3

void __thiscall mprpc::MsgPackPacker::pack_map_item(MsgPackPacker *this,char *key,uint64_t val)

{
  size_t sVar1;
  uint16_t val_1;
  size_t sVar2;
  uint16_t val_2;
  uint uVar3;
  uint64_t *puVar4;
  uchar d;
  undefined1 local_31 [9];
  uint64_t local_28;
  
  sVar1 = strlen(key);
  if (sVar1 < 0x20) {
    local_31[0] = (byte)sVar1 | 0xa0;
    sVar2 = 1;
  }
  else if (sVar1 < 0x100) {
    local_31[0] = 0xd9;
    local_31[1] = (byte)sVar1;
    sVar2 = 2;
  }
  else {
    uVar3 = (uint)sVar1;
    if (sVar1 < 0x10000) {
      local_31[0] = 0xda;
      local_31._1_2_ = (ushort)sVar1 << 8 | (ushort)sVar1 >> 8;
      sVar2 = 3;
    }
    else {
      local_31[0] = 0xdb;
      local_31._1_4_ =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      sVar2 = 5;
    }
  }
  (*(this->pk).callback)((this->pk).data,local_31,sVar2);
  (*(this->pk).callback)((this->pk).data,key,sVar1);
  if (val < 0x100) {
    if (val < 0x80) {
      puVar4 = &local_28;
      sVar2 = 1;
    }
    else {
      puVar4 = (uint64_t *)local_31;
      local_31[0] = 0xcc;
      local_31[1] = (char)val;
      sVar2 = 2;
    }
  }
  else if (val < 0x10000) {
    puVar4 = (uint64_t *)local_31;
    local_31[0] = 0xcd;
    local_31._1_2_ = (ushort)val << 8 | (ushort)val >> 8;
    sVar2 = 3;
  }
  else {
    puVar4 = (uint64_t *)local_31;
    if (val >> 0x20 == 0) {
      local_31[0] = 0xce;
      uVar3 = (uint)val;
      local_31._1_4_ =
           uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      sVar2 = 5;
    }
    else {
      local_31[0] = 0xcf;
      local_31._1_8_ =
           val >> 0x38 | (val & 0xff000000000000) >> 0x28 | (val & 0xff0000000000) >> 0x18 |
           (val & 0xff00000000) >> 8 | (val & 0xff000000) << 8 | (val & 0xff0000) << 0x18 |
           (val & 0xff00) << 0x28 | val << 0x38;
      sVar2 = 9;
    }
  }
  local_28 = val;
  (*(this->pk).callback)((this->pk).data,(char *)puVar4,sVar2);
  return;
}

Assistant:

inline void pack_map_item(const char* key, uint64_t val)
        {
            pack_string(key);
            pack_uint64(val);
        }